

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void __thiscall Assimp::JSONWriter::SimpleValue(JSONWriter *this,void *buffer,size_t len)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  ostream *poVar5;
  char *local_58;
  char *cur;
  unsigned_long uStack_48;
  int n;
  unsigned_long local_40;
  char *local_38;
  char *out;
  base64_encodestate s;
  size_t len_local;
  void *buffer_local;
  JSONWriter *this_local;
  
  s._4_8_ = len;
  base64_init_encodestate((base64_encodestate *)((long)&out + 4));
  local_40 = s._4_8_ << 1;
  uStack_48 = 0x10;
  puVar4 = std::max<unsigned_long>(&local_40,&stack0xffffffffffffffb8);
  local_38 = (char *)operator_new__(*puVar4);
  iVar2 = base64_encode_block((char *)buffer,s._4_4_,local_38,(base64_encodestate *)((long)&out + 4)
                             );
  pcVar1 = local_38;
  iVar3 = base64_encode_blockend(local_38 + iVar2,(base64_encodestate *)((long)&out + 4));
  pcVar1[iVar2 + iVar3] = '\0';
  for (local_58 = local_38; *local_58 != '\0'; local_58 = local_58 + 1) {
    if (*local_58 == '\n') {
      *local_58 = ' ';
    }
  }
  poVar5 = std::operator<<((ostream *)&this->field_0x58,'\"');
  poVar5 = std::operator<<(poVar5,local_38);
  std::operator<<(poVar5,"\"\n");
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  return;
}

Assistant:

void SimpleValue(const void* buffer, size_t len) {
        base64_encodestate s;
        base64_init_encodestate(&s);

        char* const out = new char[std::max(len * 2, static_cast<size_t>(16u))];
        const int n = base64_encode_block(reinterpret_cast<const char*>(buffer), static_cast<int>(len), out, &s);
        out[n + base64_encode_blockend(out + n, &s)] = '\0';

        // base64 encoding may add newlines, but JSON strings may not contain 'real' newlines
        // (only escaped ones). Remove any newlines in out.
        for (char* cur = out; *cur; ++cur) {
            if (*cur == '\n') {
                *cur = ' ';
            }
        }

        buff << '\"' << out << "\"\n";
        delete[] out;
    }